

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_lwm_mipsel(CPUMIPSState_conflict2 *env,target_ulong_conflict addr,
                      target_ulong_conflict reglist,uint32_t mem_idx)

{
  uint uVar1;
  uint32_t uVar2;
  uintptr_t unaff_retaddr;
  uint local_28;
  target_ulong_conflict i;
  target_ulong_conflict do_r31;
  target_ulong_conflict base_reglist;
  uint32_t mem_idx_local;
  target_ulong_conflict reglist_local;
  target_ulong_conflict addr_local;
  CPUMIPSState_conflict2 *env_local;
  
  uVar1 = reglist & 0xf;
  mem_idx_local = addr;
  if ((uVar1 != 0) && (uVar1 < 10)) {
    for (local_28 = 0; local_28 < uVar1; local_28 = local_28 + 1) {
      uVar2 = cpu_ldl_mmuidx_ra_mipsel
                        ((CPUArchState_conflict8 *)env,mem_idx_local,mem_idx,unaff_retaddr);
      (env->active_tc).gpr[multiple_regs[local_28]] = uVar2;
      mem_idx_local = mem_idx_local + 4;
    }
  }
  if ((reglist & 0x10) != 0) {
    uVar2 = cpu_ldl_mmuidx_ra_mipsel
                      ((CPUArchState_conflict8 *)env,mem_idx_local,mem_idx,unaff_retaddr);
    (env->active_tc).gpr[0x1f] = uVar2;
  }
  return;
}

Assistant:

void helper_lwm(CPUMIPSState *env, target_ulong addr, target_ulong reglist,
                uint32_t mem_idx)
{
    target_ulong base_reglist = reglist & 0xf;
    target_ulong do_r31 = reglist & 0x10;

    if (base_reglist > 0 && base_reglist <= ARRAY_SIZE(multiple_regs)) {
        target_ulong i;

        for (i = 0; i < base_reglist; i++) {
            env->active_tc.gpr[multiple_regs[i]] =
                (target_long)cpu_ldl_mmuidx_ra(env, addr, mem_idx, GETPC());
            addr += 4;
        }
    }

    if (do_r31) {
        env->active_tc.gpr[31] =
            (target_long)cpu_ldl_mmuidx_ra(env, addr, mem_idx, GETPC());
    }
}